

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

_Bool Curl_clone_primary_ssl_config(ssl_primary_config *source,ssl_primary_config *dest)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  _Bool _Var6;
  CURLcode CVar7;
  char *pcVar8;
  
  lVar2 = source->version_max;
  dest->version = source->version;
  dest->version_max = lVar2;
  bVar3 = source->field_0x68 & 1;
  bVar1 = dest->field_0x68;
  dest->field_0x68 = bVar1 & 0xfe | bVar3;
  bVar4 = source->field_0x68 & 2;
  dest->field_0x68 = bVar1 & 0xfc | bVar3 | bVar4;
  bVar5 = source->field_0x68 & 4;
  dest->field_0x68 = bVar1 & 0xf8 | bVar3 | bVar4 | bVar5;
  dest->field_0x68 = bVar1 & 0xf0 | bVar3 | bVar4 | bVar5 | source->field_0x68 & 8;
  CVar7 = blobdup(&dest->cert_blob,source->cert_blob);
  if ((CVar7 == CURLE_OK) &&
     (CVar7 = blobdup(&dest->ca_info_blob,source->ca_info_blob), CVar7 == CURLE_OK)) {
    if (source->CApath == (char *)0x0) {
      dest->CApath = (char *)0x0;
    }
    else {
      pcVar8 = (*Curl_cstrdup)(source->CApath);
      dest->CApath = pcVar8;
      if (pcVar8 == (char *)0x0) goto LAB_00151a7e;
    }
    if (source->CAfile == (char *)0x0) {
      dest->CAfile = (char *)0x0;
    }
    else {
      pcVar8 = (*Curl_cstrdup)(source->CAfile);
      dest->CAfile = pcVar8;
      if (pcVar8 == (char *)0x0) goto LAB_00151a7e;
    }
    if (source->clientcert == (char *)0x0) {
      dest->clientcert = (char *)0x0;
    }
    else {
      pcVar8 = (*Curl_cstrdup)(source->clientcert);
      dest->clientcert = pcVar8;
      if (pcVar8 == (char *)0x0) goto LAB_00151a7e;
    }
    if (source->random_file == (char *)0x0) {
      dest->random_file = (char *)0x0;
    }
    else {
      pcVar8 = (*Curl_cstrdup)(source->random_file);
      dest->random_file = pcVar8;
      if (pcVar8 == (char *)0x0) goto LAB_00151a7e;
    }
    if (source->egdsocket == (char *)0x0) {
      dest->egdsocket = (char *)0x0;
    }
    else {
      pcVar8 = (*Curl_cstrdup)(source->egdsocket);
      dest->egdsocket = pcVar8;
      if (pcVar8 == (char *)0x0) goto LAB_00151a7e;
    }
    if (source->cipher_list == (char *)0x0) {
      dest->cipher_list = (char *)0x0;
    }
    else {
      pcVar8 = (*Curl_cstrdup)(source->cipher_list);
      dest->cipher_list = pcVar8;
      if (pcVar8 == (char *)0x0) goto LAB_00151a7e;
    }
    if (source->cipher_list13 == (char *)0x0) {
      dest->cipher_list13 = (char *)0x0;
    }
    else {
      pcVar8 = (*Curl_cstrdup)(source->cipher_list13);
      dest->cipher_list13 = pcVar8;
      if (pcVar8 == (char *)0x0) goto LAB_00151a7e;
    }
    if (source->pinned_key == (char *)0x0) {
      dest->pinned_key = (char *)0x0;
    }
    else {
      pcVar8 = (*Curl_cstrdup)(source->pinned_key);
      dest->pinned_key = pcVar8;
      if (pcVar8 == (char *)0x0) goto LAB_00151a7e;
    }
    if (source->curves == (char *)0x0) {
      dest->curves = (char *)0x0;
    }
    else {
      pcVar8 = (*Curl_cstrdup)(source->curves);
      dest->curves = pcVar8;
      if (pcVar8 == (char *)0x0) goto LAB_00151a7e;
    }
    _Var6 = true;
  }
  else {
LAB_00151a7e:
    _Var6 = false;
  }
  return _Var6;
}

Assistant:

bool
Curl_clone_primary_ssl_config(struct ssl_primary_config *source,
                              struct ssl_primary_config *dest)
{
  dest->version = source->version;
  dest->version_max = source->version_max;
  dest->verifypeer = source->verifypeer;
  dest->verifyhost = source->verifyhost;
  dest->verifystatus = source->verifystatus;
  dest->sessionid = source->sessionid;

  CLONE_BLOB(cert_blob);
  CLONE_BLOB(ca_info_blob);
  CLONE_STRING(CApath);
  CLONE_STRING(CAfile);
  CLONE_STRING(clientcert);
  CLONE_STRING(random_file);
  CLONE_STRING(egdsocket);
  CLONE_STRING(cipher_list);
  CLONE_STRING(cipher_list13);
  CLONE_STRING(pinned_key);
  CLONE_STRING(curves);

  return TRUE;
}